

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

Block * __thiscall
google::protobuf::internal::ArenaImpl::NewBlock(ArenaImpl *this,Block *last_block,size_t min_bytes)

{
  LogMessage *other;
  Block *this_00;
  ulong uVar1;
  ulong uVar2;
  LogMessage local_70;
  LogFinisher local_31;
  
  if (last_block == (Block *)0x0) {
    uVar2 = (this->options_).start_block_size;
  }
  else {
    uVar2 = last_block->size_ * 2;
    uVar1 = (this->options_).max_block_size;
    if (uVar1 < uVar2) {
      uVar2 = uVar1;
    }
  }
  if (0xffffffffffffffe7 < min_bytes) {
    LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/arena.cc"
               ,0x76);
    other = LogMessage::operator<<
                      (&local_70,
                       "CHECK failed: (min_bytes) <= (std::numeric_limits<size_t>::max() - kBlockHeaderSize): "
                      );
    LogFinisher::operator=(&local_31,other);
    LogMessage::~LogMessage(&local_70);
  }
  uVar1 = min_bytes + 0x18;
  if (min_bytes + 0x18 < uVar2) {
    uVar1 = uVar2;
  }
  this_00 = (Block *)(*(this->options_).block_alloc)(uVar1);
  Block::Block(this_00,uVar1,last_block);
  LOCK();
  (this->space_allocated_).super___atomic_base<unsigned_long>._M_i =
       (this->space_allocated_).super___atomic_base<unsigned_long>._M_i + uVar1;
  UNLOCK();
  return this_00;
}

Assistant:

ArenaImpl::Block* ArenaImpl::NewBlock(Block* last_block, size_t min_bytes) {
  size_t size;
  if (last_block) {
    // Double the current block size, up to a limit.
    size = std::min(2 * last_block->size(), options_.max_block_size);
  } else {
    size = options_.start_block_size;
  }
  // Verify that min_bytes + kBlockHeaderSize won't overflow.
  GOOGLE_CHECK_LE(min_bytes, std::numeric_limits<size_t>::max() - kBlockHeaderSize);
  size = std::max(size, kBlockHeaderSize + min_bytes);

  void* mem = options_.block_alloc(size);
  Block* b = new (mem) Block(size, last_block);
  space_allocated_.fetch_add(size, std::memory_order_relaxed);
  return b;
}